

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astar.cpp
# Opt level: O0

bool __thiscall
indigox::algorithm::ItemCompare::operator()
          (ItemCompare *this,p_AStarQueueItem *a,p_AStarQueueItem *b)

{
  Score SVar1;
  Score SVar2;
  Score SVar3;
  element_type *peVar4;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *pdVar5;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffb0;
  
  peVar4 = std::
           __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x13bbef);
  if ((peVar4->path_cost == Options::AssignElectrons::INF) ||
     (peVar4 = std::
               __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x13bc0a), peVar4->heuristic_cost == Options::AssignElectrons::INF))
  {
    peVar4 = std::
             __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x13bc25);
    if ((peVar4->path_cost != Options::AssignElectrons::INF) &&
       (peVar4 = std::
                 __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x13bc40), peVar4->heuristic_cost != Options::AssignElectrons::INF)
       ) {
      return true;
    }
    return false;
  }
  peVar4 = std::
           __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x13bc6f);
  if ((peVar4->path_cost != Options::AssignElectrons::INF) &&
     (peVar4 = std::
               __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x13bc8a), peVar4->heuristic_cost != Options::AssignElectrons::INF))
  {
    peVar4 = std::
             __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x13bcaf);
    SVar1 = peVar4->path_cost;
    peVar4 = std::
             __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x13bcc3);
    SVar2 = peVar4->heuristic_cost;
    peVar4 = std::
             __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x13bcde);
    SVar3 = peVar4->path_cost;
    peVar4 = std::
             __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x13bcf2);
    if (SVar1 + SVar2 == SVar3 + peVar4->heuristic_cost) {
      std::
      __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x13bd11);
      this_00 = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count
                          (in_stack_ffffffffffffffb0);
      std::
      __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x13bd2c);
      pdVar5 = (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
               boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count(this_00);
      return pdVar5 < this_00;
    }
    peVar4 = std::
             __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x13bd58);
    SVar1 = peVar4->path_cost;
    peVar4 = std::
             __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x13bd6c);
    SVar2 = peVar4->heuristic_cost;
    peVar4 = std::
             __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x13bd87);
    SVar3 = peVar4->path_cost;
    peVar4 = std::
             __shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<indigox::algorithm::AStarQueueItem,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x13bd9b);
    return SVar3 + peVar4->heuristic_cost < SVar1 + SVar2;
  }
  return false;
}

Assistant:

bool ItemCompare::operator()(const p_AStarQueueItem a, const p_AStarQueueItem b)  {
  if (a->path_cost == opt_::INF || a->heuristic_cost == opt_::INF) {
    if (b->path_cost == opt_::INF || b->heuristic_cost == opt_::INF)
      return false;
    else
      return true;
  } else if (b->path_cost == opt_::INF || b->heuristic_cost == opt_::INF)
    return false;
  else if ((a->path_cost+a->heuristic_cost) == (b->path_cost+b->heuristic_cost))
    return (a->calculable.count()) > (b->calculable.count());
  else return (a->path_cost+a->heuristic_cost) > (b->path_cost+b->heuristic_cost);
}